

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef llvm::yaml::ScalarTraits<unsigned_char,_void>::input
                    (StringRef Scalar,void *param_2,uint8_t *Val)

{
  bool bVar1;
  unsigned_long_long *in_R8;
  StringRef Str;
  ulong local_40;
  unsigned_long_long n;
  uint8_t *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Str.Data = (char *)Scalar.Length;
  param_1_local = Scalar.Data;
  Str.Length = 0;
  n = (unsigned_long_long)Val;
  Val_local = (uint8_t *)param_2;
  Scalar_local.Data = Str.Data;
  bVar1 = getAsUnsignedInteger((llvm *)param_1_local,Str,(uint)&local_40,in_R8);
  if (bVar1) {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"invalid number");
  }
  else if (local_40 < 0x100) {
    *(char *)n = (char)local_40;
    memset(&Scalar_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Scalar_local.Length);
  }
  else {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"out of range number");
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef ScalarTraits<uint8_t>::input(StringRef Scalar, void *, uint8_t &Val) {
  unsigned long long n;
  if (getAsUnsignedInteger(Scalar, 0, n))
    return "invalid number";
  if (n > 0xFF)
    return "out of range number";
  Val = n;
  return StringRef();
}